

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obs2gal.cpp
# Opt level: O3

CEExecOptions * DefineOpts(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  CEExecOptions *in_RDI;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"obs2gal","");
  CEExecOptions::CEExecOptions(in_RDI,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0 = &local_c0;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c0 = *plVar3;
    lStack_b8 = plVar2[3];
  }
  else {
    local_c0 = *plVar3;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a0 = *plVar3;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar3;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_f0.field_2._M_allocated_capacity = *psVar4;
    local_f0.field_2._8_8_ = plVar2[3];
    local_f0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar4;
    local_f0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_f0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(in_RDI->super_CLOptions).program_desc_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  CEExecOptions::AddObserverPars(in_RDI);
  CEExecOptions::AddObservedPars(in_RDI);
  CEExecOptions::AddJDPar(in_RDI);
  return in_RDI;
}

Assistant:

CEExecOptions DefineOpts()
{
    CEExecOptions opts("obs2gal");

    // Add a program version and description
    opts.AddProgramDescription(std::string() +
        "Takes observed positions (azimuth,zenith angle) and computes the " +
        "Galactic longitude,latitude positions based on the observer location " +
        "and atmospheric properties. The only values necessary to get rough " +
        "coordinates are 'longitude', 'latitude', 'azimuth', 'zenith', and " +
        "'juliandate'.") ;
    
    // Setup the defaults
    opts.AddObserverPars();
    opts.AddObservedPars();
    opts.AddJDPar();

    return opts ;
}